

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableModelValidatorTests.cpp
# Opt level: O0

int testValid_Classifier_PredictedFeatureNameAndTarget(void)

{
  bool bVar1;
  ModelDescription *pMVar2;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar3;
  reference from;
  NeuralNetworkClassifier *this;
  NetworkUpdateParameters *this_00;
  LossLayer *this_01;
  CategoricalCrossEntropyLossLayer *this_02;
  string *psVar4;
  FeatureType *pFVar5;
  FeatureDescription *pFVar6;
  ostream *poVar7;
  string *local_3b0;
  Result local_218;
  FeatureDescription *local_1f0;
  FeatureDescription *trainingInput2;
  ArrayFeatureType *trainingInputTensorShape;
  string target;
  FeatureDescription *trainingInput;
  FeatureDescription *trainingInput_1;
  FeatureDescription feature;
  const_iterator __end1;
  const_iterator __begin1;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *__range1;
  pointer plStack_160;
  pointer local_158;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_150;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_131;
  undefined1 local_130 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  classLabels;
  undefined1 local_108 [8];
  string labels [4];
  TensorAttributes tensorAttributesIn;
  undefined1 local_68 [8];
  Result res;
  Model spec;
  
  CoreML::Specification::Model::Model((Model *)((long)&res.m_message.field_2 + 8));
  CoreML::Result::Result((Result *)local_68);
  labels[3].field_2._8_8_ = anon_var_dwarf_75a77;
  classLabels.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_108,"1",
             (allocator<char> *)
             ((long)&classLabels.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(labels[0].field_2._M_local_buf + 8),"2",
             (allocator<char> *)
             ((long)&classLabels.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(labels[1].field_2._M_local_buf + 8),"3",
             (allocator<char> *)
             ((long)&classLabels.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 5));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(labels[2].field_2._M_local_buf + 8),"4",
             (allocator<char> *)
             ((long)&classLabels.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  classLabels.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&classLabels.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&classLabels.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 5));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&classLabels.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&classLabels.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_131);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  vector<std::__cxx11::string*,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_130,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&labels[3].field_2 + 8),&local_131);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_131);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_150,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_130);
  __range1 = (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x0;
  plStack_160 = (pointer)0x0;
  local_158 = (pointer)0x0;
  std::vector<long,_std::allocator<long>_>::vector((vector<long,_std::allocator<long>_> *)&__range1)
  ;
  buildBasicNeuralNetworkClassifierModel
            ((Model *)((long)&res.m_message.field_2 + 8),true,
             (TensorAttributes *)((long)&labels[3].field_2 + 8),&local_150,
             (vector<long,_std::allocator<long>_> *)&__range1,true);
  std::vector<long,_std::allocator<long>_>::~vector
            ((vector<long,_std::allocator<long>_> *)&__range1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_150);
  CoreML::Specification::Model::set_specificationversion
            ((Model *)((long)&res.m_message.field_2 + 8),4);
  pMVar2 = CoreML::Specification::Model::mutable_description
                     ((Model *)((long)&res.m_message.field_2 + 8));
  CoreML::Specification::ModelDescription::clear_traininginput(pMVar2);
  pMVar2 = CoreML::Specification::Model::description((Model *)((long)&res.m_message.field_2 + 8));
  pRVar3 = CoreML::Specification::ModelDescription::input(pMVar2);
  __end1 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::begin
                     (pRVar3);
  feature._40_8_ =
       google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::end(pRVar3);
  while (bVar1 = google::protobuf::internal::
                 RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator!=
                           (&__end1,(iterator *)&feature._cached_size_), bVar1) {
    from = google::protobuf::internal::
           RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator*(&__end1);
    CoreML::Specification::FeatureDescription::FeatureDescription
              ((FeatureDescription *)&trainingInput_1,from);
    pMVar2 = CoreML::Specification::Model::mutable_description
                       ((Model *)((long)&res.m_message.field_2 + 8));
    pRVar3 = CoreML::Specification::ModelDescription::mutable_traininginput(pMVar2);
    pFVar6 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                       (pRVar3);
    CoreML::Specification::FeatureDescription::CopyFrom
              (pFVar6,(FeatureDescription *)&trainingInput_1);
    CoreML::Specification::FeatureDescription::~FeatureDescription
              ((FeatureDescription *)&trainingInput_1);
    google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>
    ::operator++(&__end1);
  }
  pMVar2 = CoreML::Specification::Model::mutable_description
                     ((Model *)((long)&res.m_message.field_2 + 8));
  pRVar3 = CoreML::Specification::ModelDescription::mutable_traininginput(pMVar2);
  target.field_2._8_8_ =
       google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add(pRVar3);
  this = CoreML::Specification::Model::neuralnetworkclassifier
                   ((Model *)((long)&res.m_message.field_2 + 8));
  this_00 = CoreML::Specification::NeuralNetworkClassifier::updateparams(this);
  this_01 = CoreML::Specification::NetworkUpdateParameters::losslayers(this_00,0);
  this_02 = CoreML::Specification::LossLayer::categoricalcrossentropylosslayer(this_01);
  psVar4 = CoreML::Specification::CategoricalCrossEntropyLossLayer::target_abi_cxx11_(this_02);
  std::__cxx11::string::string((string *)&trainingInputTensorShape,(string *)psVar4);
  CoreML::Specification::FeatureDescription::set_name
            ((FeatureDescription *)target.field_2._8_8_,(string *)&trainingInputTensorShape);
  pFVar5 = CoreML::Specification::FeatureDescription::mutable_type
                     ((FeatureDescription *)target.field_2._8_8_);
  trainingInput2 =
       (FeatureDescription *)CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar5);
  CoreML::Specification::ArrayFeatureType::set_datatype
            ((ArrayFeatureType *)trainingInput2,ArrayFeatureType_ArrayDataType_INT32);
  CoreML::Specification::ArrayFeatureType::add_shape((ArrayFeatureType *)trainingInput2,1);
  pMVar2 = CoreML::Specification::Model::mutable_description
                     ((Model *)((long)&res.m_message.field_2 + 8));
  pRVar3 = CoreML::Specification::ModelDescription::mutable_traininginput(pMVar2);
  pFVar6 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (pRVar3);
  local_1f0 = pFVar6;
  pMVar2 = CoreML::Specification::Model::description((Model *)((long)&res.m_message.field_2 + 8));
  psVar4 = CoreML::Specification::ModelDescription::predictedfeaturename_abi_cxx11_(pMVar2);
  CoreML::Specification::FeatureDescription::set_name(pFVar6,psVar4);
  pFVar5 = CoreML::Specification::FeatureDescription::mutable_type(local_1f0);
  CoreML::Specification::FeatureType::mutable_stringtype(pFVar5);
  CoreML::Model::validate(&local_218,(Model *)((long)&res.m_message.field_2 + 8));
  CoreML::Result::operator=((Result *)local_68,&local_218);
  CoreML::Result::~Result(&local_218);
  bVar1 = CoreML::Result::good((Result *)local_68);
  if (!bVar1) {
    poVar7 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                            );
    poVar7 = std::operator<<(poVar7,":");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x91c);
    poVar7 = std::operator<<(poVar7,": error: ");
    poVar7 = std::operator<<(poVar7,"(res).good()");
    poVar7 = std::operator<<(poVar7," was false, expected true.");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  }
  spec._oneof_case_[0]._1_3_ = 0;
  spec._oneof_case_[0]._0_1_ = !bVar1;
  std::__cxx11::string::~string((string *)&trainingInputTensorShape);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_130);
  local_3b0 = (string *)(labels[3].field_2._M_local_buf + 8);
  do {
    local_3b0 = local_3b0 + -0x20;
    std::__cxx11::string::~string(local_3b0);
  } while (local_3b0 != (string *)local_108);
  CoreML::Result::~Result((Result *)local_68);
  CoreML::Specification::Model::~Model((Model *)((long)&res.m_message.field_2 + 8));
  return spec._oneof_case_[0];
}

Assistant:

int testValid_Classifier_PredictedFeatureNameAndTarget() {
    Specification::Model spec;
    Result res;
    TensorAttributes tensorAttributesIn = { "InTensor", 3 };

    std::string labels[] = { "1", "2", "3", "4" };
    std::vector<std::string> classLabels(labels, labels + sizeof(labels) / sizeof(std::string));

    (void)buildBasicNeuralNetworkClassifierModel(spec, true, &tensorAttributesIn, classLabels, std::vector<int64_t>(), true);
    spec.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS13);

    // Clearing and then specifically adding only the predicted feature name as a training input (for the classifier)
    spec.mutable_description()->clear_traininginput();

    // Re-adding model inputs and the target + predicted feature nmae to classifier's training inputs
    for (auto feature : spec.description().input()) {
        auto trainingInput = spec.mutable_description()->mutable_traininginput()->Add();
        trainingInput->CopyFrom(feature);
    }

    auto trainingInput = spec.mutable_description()->mutable_traininginput()->Add();
    std::string target = spec.neuralnetworkclassifier().updateparams().losslayers(0).categoricalcrossentropylosslayer().target();
    trainingInput->set_name(target);
    auto trainingInputTensorShape = trainingInput->mutable_type()->mutable_multiarraytype();
    trainingInputTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_INT32);
    trainingInputTensorShape->add_shape(1);

    auto trainingInput2 = spec.mutable_description()->mutable_traininginput()->Add();
    trainingInput2->set_name(spec.description().predictedfeaturename());
    trainingInput2->mutable_type()->mutable_stringtype();

    res = Model::validate(spec);
    ML_ASSERT_GOOD(res);

    return 0;
}